

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O1

string * __thiscall
Catch::StringMaker<char*,void>::convert_abi_cxx11_
          (string *__return_storage_ptr__,StringMaker<char*,void> *this,char *str)

{
  size_t sVar1;
  string local_40;
  
  if (this == (StringMaker<char*,void> *)0x0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,"{null string}","");
  }
  else {
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    sVar1 = strlen((char *)this);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,this,this + sVar1);
    StringMaker<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
    ::convert(__return_storage_ptr__,&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string StringMaker<char *>::convert(char *str) {
        if (str) {
            return ::Catch::Detail::stringify(std::string{ str });
        }
        else {
            return{ "{null string}" };
        }
    }